

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_token_write_folded(fy_emitter *emit,fy_token *fyt,int flags,int indent)

{
  fy_emitter *pfVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  fy_atom *atom;
  bool bVar8;
  int flags_00;
  uint uVar9;
  char chomp;
  fy_atom_iter iter;
  char local_221;
  fy_emit_accum *local_220;
  fy_atom_iter local_218;
  
  iVar6 = indent;
  fy_emit_write_indicator(emit,di_greater,flags,indent,fyewt_indicator);
  fy_emit_token_write_block_hints(emit,fyt,flags_00,iVar6,&local_221);
  if ((flags & 1U) != 0) {
    uVar5 = emit->cfg->flags >> 8 & 0xf;
    uVar9 = 2;
    if (uVar5 != 0) {
      uVar9 = uVar5;
    }
    indent = indent + uVar9;
  }
  fy_emit_putc(emit,fyewt_linebreak,10);
  *(byte *)&emit->flags = (byte)emit->flags | 3;
  atom = fy_token_atom(fyt);
  if (atom != (fy_atom *)0x0) {
    fy_atom_iter_start(atom,&local_218);
    pfVar1 = (emit->ea).emit;
    if (pfVar1 == (fy_emitter *)0x0) {
      __assert_fail("ea->emit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.h"
                    ,0x85,
                    "void fy_emit_accum_start(struct fy_emit_accum *, enum fy_emitter_write_type)");
    }
    iVar6 = pfVar1->column;
    (emit->ea).start_col = iVar6;
    (emit->ea).type = fyewt_folded_scalar;
    (emit->ea).next = 0;
    (emit->ea).utf8_count = 0;
    (emit->ea).col = iVar6;
    iVar6 = fy_atom_iter_utf8_get(&local_218);
    if (0 < iVar6) {
      local_220 = &emit->ea;
      bVar8 = true;
      bVar3 = true;
LAB_00128213:
      if (iVar6 < 0x2028) {
        bVar4 = true;
        if (((iVar6 != 10) && (bVar4 = true, iVar6 != 0xd)) && (bVar4 = true, iVar6 != 0x85)) {
LAB_0012823d:
          bVar4 = false;
        }
      }
      else {
        bVar4 = true;
        if (1 < iVar6 - 0x2028U) goto LAB_0012823d;
      }
      if (bVar4) {
        if ((emit->ea).utf8_count != 0) {
          sVar2 = (emit->ea).next;
          if (sVar2 != 0) {
            fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar2);
          }
          (emit->ea).next = 0;
          (emit->ea).utf8_count = 0;
          (emit->ea).col = (emit->ea).start_col;
          iVar6 = fy_atom_iter_utf8_peek(&local_218);
          if ((0 < iVar6) && (!bVar8)) {
            fy_emit_write_indent(emit,indent);
          }
        }
        uVar9 = 1;
        do {
          iVar6 = fy_atom_iter_utf8_peek(&local_218);
          if (iVar6 < 0x2028) {
            if (((iVar6 != 10) && (iVar6 != 0xd)) && (iVar6 != 0x85)) goto LAB_00128366;
          }
          else if (1 < iVar6 - 0x2028U) goto LAB_00128366;
          uVar9 = uVar9 + 1;
          fy_atom_iter_utf8_get(&local_218);
        } while( true );
      }
      if (bVar3) {
        fy_emit_write_indent(emit,indent);
        bVar8 = iVar6 == 9 || iVar6 == 0x20;
      }
      if ((bVar3 || iVar6 != 0x20) || (iVar7 = fy_atom_iter_utf8_peek(&local_218), iVar7 == 0x20)) {
LAB_00128400:
        fy_emit_accum_utf8_put(local_220,iVar6);
      }
      else {
        uVar9 = emit->cfg->flags >> 0xc;
        if ((char)uVar9 == '\0') {
          uVar9 = 0x50;
        }
        else if ((uVar9 & 0xff) == 0xff) {
          uVar9 = 0x7fffffff;
        }
        else {
          uVar9 = uVar9 & 0xff;
        }
        if ((emit->ea).col <= (int)uVar9) goto LAB_00128400;
        sVar2 = (emit->ea).next;
        if (sVar2 != 0) {
          fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar2);
        }
        (emit->ea).next = 0;
        (emit->ea).utf8_count = 0;
        (emit->ea).col = (emit->ea).start_col;
        *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
        fy_emit_write_indent(emit,indent);
      }
      goto LAB_0012840d;
    }
LAB_00128420:
    sVar2 = (emit->ea).next;
    if (sVar2 != 0) {
      fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar2);
    }
    (emit->ea).next = 0;
    (emit->ea).utf8_count = 0;
    (emit->ea).col = (emit->ea).start_col;
    fy_atom_iter_finish(&local_218);
  }
  return;
LAB_00128366:
  uVar5 = (uint)(iVar6 == 9 || iVar6 == 0x20);
  if (iVar6 < 1) {
    uVar5 = 2;
  }
  if (uVar5 < uVar9) {
    do {
      uVar9 = uVar9 - 1;
      *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
      fy_emit_write_indent(emit,indent);
    } while ((int)uVar5 < (int)uVar9);
  }
LAB_0012840d:
  iVar6 = fy_atom_iter_utf8_get(&local_218);
  bVar3 = bVar4;
  if (iVar6 < 1) goto LAB_00128420;
  goto LAB_00128213;
}

Assistant:

void fy_emit_token_write_folded(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent) {
    bool leading_spaces, breaks;
    int c, nrbreaks, nrbreakslim;
    char chomp;
    struct fy_atom *atom;
    struct fy_atom_iter iter;

    fy_emit_write_indicator(emit, di_greater, flags, indent, fyewt_indicator);

    fy_emit_token_write_block_hints(emit, fyt, flags, indent, &chomp);
    if (flags & DDNF_ROOT)
        indent += fy_emit_indent(emit);

    fy_emit_putc(emit, fyewt_linebreak, '\n');
    emit->flags |= FYEF_WHITESPACE | FYEF_INDENTATION;

    atom = fy_token_atom(fyt);
    if (!atom)
        return;

    breaks = true;
    leading_spaces = true;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, fyewt_folded_scalar);
    while ((c = fy_atom_iter_utf8_get(&iter)) > 0) {

        if (fy_is_lb(c)) {

            /* output run */
            if (fy_emit_accum_utf8_size(&emit->ea)) {
                fy_emit_accum_output(&emit->ea);
                /* do not output a newline (indent) if at the end or
                 * this is a leading spaces line */
                if (!fy_is_z(fy_atom_iter_utf8_peek(&iter)) && !leading_spaces)
                    fy_emit_write_indent(emit, indent);
            }

            /* count the number of consecutive breaks */
            nrbreaks = 1;
            while (fy_is_lb(c = fy_atom_iter_utf8_peek(&iter))) {
                nrbreaks++;
                (void) fy_atom_iter_utf8_get(&iter);
            }

            /* NOTE: Because the number of indents is tricky
             * if it's a non blank, non end, it's the number of breaks
             * if it's a blank, it's the number of breaks minus 1
             * if it's the end, it's the number of breaks minus 2
             */
            nrbreakslim = fy_is_z(c) ? 2 : fy_is_blank(c) ? 1 : 0;
            while (nrbreaks-- > nrbreakslim) {
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            }

            breaks = true;

        } else {

            /* if we had a break, output an indent */
            if (breaks) {
                fy_emit_write_indent(emit, indent);

                /* if this line starts with whitespace we need to know */
                leading_spaces = fy_is_ws(c);
            }

            if (!breaks && fy_is_space(c) &&
                !fy_is_space(fy_atom_iter_utf8_peek(&iter)) &&
                fy_emit_accum_column(&emit->ea) > fy_emit_width(emit)) {
                fy_emit_accum_output(&emit->ea);
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);
}